

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

Boxed_Value __thiscall chaiscript::const_var(chaiscript *this,bool b)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  Boxed_Value *pBVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  Boxed_Value BVar4;
  bool local_1a;
  bool local_19;
  
  if (const_var(bool)::t == '\0') {
    iVar2 = __cxa_guard_acquire(&const_var(bool)::t);
    in_RDX._M_pi = extraout_RDX;
    if (iVar2 != 0) {
      local_19 = true;
      detail::const_var_impl<bool>((detail *)&const_var::t,&local_19);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&const_var::t,&__dso_handle);
      __cxa_guard_release(&const_var(bool)::t);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  if (const_var(bool)::f == '\0') {
    iVar2 = __cxa_guard_acquire(&const_var(bool)::f);
    in_RDX._M_pi = extraout_RDX_01;
    if (iVar2 != 0) {
      local_1a = false;
      detail::const_var_impl<bool>((detail *)&const_var::f,&local_1a);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&const_var::f,&__dso_handle);
      __cxa_guard_release(&const_var(bool)::f);
      in_RDX._M_pi = extraout_RDX_02;
    }
  }
  if (b) {
    pBVar3 = &const_var::t;
  }
  else {
    pBVar3 = &const_var::f;
  }
  *(element_type **)this =
       (pBVar3->m_data).
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (pBVar3->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Boxed_Value const_var(bool b) {
    static const auto t = detail::const_var_impl(true);
    static const auto f = detail::const_var_impl(false);

    if (b) {
      return t;
    } else {
      return f;
    }
  }